

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void __thiscall bodyArg::term_async(bodyArg *this)

{
  vm_globalvar_t *in_RDI;
  CVmObjTable *unaff_retaddr;
  vm_globalvar_t *var;
  
  var = in_RDI;
  if ((in_RDI[1].nxt != (vm_globalvar_t *)0x0) && (in_RDI[1].nxt != (vm_globalvar_t *)0x0)) {
    (**(code **)(*(long *)&(in_RDI[1].nxt)->val + 8))();
  }
  if (in_RDI[2].nxt != (vm_globalvar_t *)0x0) {
    CVmObjTable::delete_global_var(unaff_retaddr,var);
  }
  return;
}

Assistant:

void term_async(VMG0_)
    {
        /* delete our data source */
        if (datasource != 0)
            delete datasource;

        /* delete our VM global */
        if (gv != 0)
            G_obj_table->delete_global_var(gv);
    }